

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3AddPrimaryKey(Parse *pParse,ExprList *pList,int onError,int autoInc,int sortOrder)

{
  Table *pTVar1;
  char *zLeft;
  int iVar2;
  Expr *pEVar3;
  int in_ECX;
  u8 in_DL;
  int *in_RSI;
  Parse *in_RDI;
  int in_R8D;
  Expr *pCExpr_1;
  char *zCName;
  Expr *pCExpr;
  int nTerm;
  int i;
  int iCol;
  Column *pCol;
  Table *pTab;
  int in_stack_00000094;
  ExprList *in_stack_00000098;
  SrcList *in_stack_000000a0;
  Token *in_stack_000000a8;
  Token *in_stack_000000b0;
  Parse *in_stack_000000b8;
  Token *in_stack_00000150;
  Expr *in_stack_00000158;
  int in_stack_00000160;
  int in_stack_00000168;
  u8 in_stack_00000170;
  ExprList *in_stack_ffffffffffffff78;
  sqlite3 *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int local_3c;
  int local_38;
  int local_34;
  Column *local_30;
  
  pTVar1 = in_RDI->pNewTable;
  local_30 = (Column *)0x0;
  local_34 = -1;
  if (pTVar1 != (Table *)0x0) {
    if ((pTVar1->tabFlags & 4) == 0) {
      pTVar1->tabFlags = pTVar1->tabFlags | 4;
      if (in_RSI == (int *)0x0) {
        local_34 = pTVar1->nCol + -1;
        local_30 = pTVar1->aCol + local_34;
        makeColumnPartOfPrimaryKey
                  ((Parse *)in_stack_ffffffffffffff80,(Column *)in_stack_ffffffffffffff78);
        local_3c = 1;
      }
      else {
        local_3c = *in_RSI;
        for (local_38 = 0; local_38 < local_3c; local_38 = local_38 + 1) {
          pEVar3 = sqlite3ExprSkipCollate(*(Expr **)(in_RSI + (long)local_38 * 6 + 2));
          sqlite3StringToId(pEVar3);
          if (pEVar3->op == '<') {
            zLeft = (pEVar3->u).zToken;
            for (local_34 = 0; local_34 < pTVar1->nCol; local_34 = local_34 + 1) {
              iVar2 = sqlite3StrICmp(zLeft,pTVar1->aCol[local_34].zCnName);
              if (iVar2 == 0) {
                local_30 = pTVar1->aCol + local_34;
                makeColumnPartOfPrimaryKey
                          ((Parse *)in_stack_ffffffffffffff80,(Column *)in_stack_ffffffffffffff78);
                break;
              }
            }
          }
        }
      }
      if ((((local_3c == 1) && (local_30 != (Column *)0x0)) && ((byte)local_30->field_0x8 >> 4 == 4)
          ) && (in_R8D != 1)) {
        if ((1 < in_RDI->eParseMode) && (in_RSI != (int *)0x0)) {
          pEVar3 = sqlite3ExprSkipCollate(*(Expr **)(in_RSI + 2));
          sqlite3RenameTokenRemap(in_RDI,&pTVar1->iPKey,pEVar3);
        }
        pTVar1->iPKey = (i16)local_34;
        pTVar1->keyConf = in_DL;
        pTVar1->tabFlags = in_ECX << 3 | pTVar1->tabFlags;
        if (in_RSI != (int *)0x0) {
          in_RDI->iPkSortOrder = (u8)in_RSI[6];
        }
        sqlite3HasExplicitNulls
                  ((Parse *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                   (ExprList *)in_stack_ffffffffffffff80);
      }
      else if (in_ECX == 0) {
        in_stack_ffffffffffffff78 = (ExprList *)0x0;
        in_stack_ffffffffffffff80 = (sqlite3 *)0x0;
        sqlite3CreateIndex(in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,
                           in_stack_00000098,in_stack_00000094,in_stack_00000150,in_stack_00000158,
                           in_stack_00000160,in_stack_00000168,in_stack_00000170);
      }
      else {
        sqlite3ErrorMsg(in_RDI,"AUTOINCREMENT is only allowed on an INTEGER PRIMARY KEY");
      }
    }
    else {
      sqlite3ErrorMsg(in_RDI,"table \"%s\" has more than one primary key",pTVar1->zName);
    }
  }
  sqlite3ExprListDelete(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddPrimaryKey(
  Parse *pParse,    /* Parsing context */
  ExprList *pList,  /* List of field names to be indexed */
  int onError,      /* What to do with a uniqueness conflict */
  int autoInc,      /* True if the AUTOINCREMENT keyword is present */
  int sortOrder     /* SQLITE_SO_ASC or SQLITE_SO_DESC */
){
  Table *pTab = pParse->pNewTable;
  Column *pCol = 0;
  int iCol = -1, i;
  int nTerm;
  if( pTab==0 ) goto primary_key_exit;
  if( pTab->tabFlags & TF_HasPrimaryKey ){
    sqlite3ErrorMsg(pParse,
      "table \"%s\" has more than one primary key", pTab->zName);
    goto primary_key_exit;
  }
  pTab->tabFlags |= TF_HasPrimaryKey;
  if( pList==0 ){
    iCol = pTab->nCol - 1;
    pCol = &pTab->aCol[iCol];
    makeColumnPartOfPrimaryKey(pParse, pCol);
    nTerm = 1;
  }else{
    nTerm = pList->nExpr;
    for(i=0; i<nTerm; i++){
      Expr *pCExpr = sqlite3ExprSkipCollate(pList->a[i].pExpr);
      assert( pCExpr!=0 );
      sqlite3StringToId(pCExpr);
      if( pCExpr->op==TK_ID ){
        const char *zCName;
        assert( !ExprHasProperty(pCExpr, EP_IntValue) );
        zCName = pCExpr->u.zToken;
        for(iCol=0; iCol<pTab->nCol; iCol++){
          if( sqlite3StrICmp(zCName, pTab->aCol[iCol].zCnName)==0 ){
            pCol = &pTab->aCol[iCol];
            makeColumnPartOfPrimaryKey(pParse, pCol);
            break;
          }
        }
      }
    }
  }
  if( nTerm==1
   && pCol
   && pCol->eCType==COLTYPE_INTEGER
   && sortOrder!=SQLITE_SO_DESC
  ){
    if( IN_RENAME_OBJECT && pList ){
      Expr *pCExpr = sqlite3ExprSkipCollate(pList->a[0].pExpr);
      sqlite3RenameTokenRemap(pParse, &pTab->iPKey, pCExpr);
    }
    pTab->iPKey = iCol;
    pTab->keyConf = (u8)onError;
    assert( autoInc==0 || autoInc==1 );
    pTab->tabFlags |= autoInc*TF_Autoincrement;
    if( pList ) pParse->iPkSortOrder = pList->a[0].fg.sortFlags;
    (void)sqlite3HasExplicitNulls(pParse, pList);
  }else if( autoInc ){
#ifndef SQLITE_OMIT_AUTOINCREMENT
    sqlite3ErrorMsg(pParse, "AUTOINCREMENT is only allowed on an "
       "INTEGER PRIMARY KEY");
#endif
  }else{
    sqlite3CreateIndex(pParse, 0, 0, 0, pList, onError, 0,
                           0, sortOrder, 0, SQLITE_IDXTYPE_PRIMARYKEY);
    pList = 0;
  }

primary_key_exit:
  sqlite3ExprListDelete(pParse->db, pList);
  return;
}